

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_typed_attr<std::array<float,4ul>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttributeWithFallback<std::array<float,_4UL>_> *attr,string *name,uint32_t indent)

{
  bool bVar1;
  ostream *poVar2;
  array<float,_4UL> *v;
  string *psVar3;
  long lVar4;
  uint32_t uVar5;
  string *psVar6;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  stringstream ss;
  string sStack_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  psVar6 = name;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar1 = TypedAttributeWithFallback<std::array<float,_4UL>_>::authored
                    ((TypedAttributeWithFallback<std::array<float,_4UL>_> *)this);
  if (!bVar1) goto LAB_0025459d;
  bVar1 = AttrMetas::authored((AttrMetas *)this);
  if ((bVar1) || (this[0x248] != (tinyusdz)0x0)) {
LAB_0025434a:
    uVar5 = (uint32_t)psVar6;
    pprint::Indent_abi_cxx11_(&sStack_1f8,(pprint *)((ulong)name & 0xffffffff),n);
    ::std::operator<<(local_1a8,(string *)&sStack_1f8);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,"uniform ");
    value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
    poVar2 = ::std::operator<<(local_1a8,(string *)&sStack_1f8);
    poVar2 = ::std::operator<<(poVar2," ");
    ::std::operator<<(poVar2,(string *)attr);
    ::std::__cxx11::string::_M_dispose();
    if (this[0x248] == (tinyusdz)0x1) {
      ::std::operator<<(local_1a8," = None");
    }
    else {
      poVar2 = ::std::operator<<(local_1a8," = ");
      v = TypedAttributeWithFallback<std::array<float,_4UL>_>::get_value
                    ((TypedAttributeWithFallback<std::array<float,_4UL>_> *)this);
      ::std::operator<<(poVar2,v);
    }
    bVar1 = AttrMetas::authored((AttrMetas *)this);
    if (bVar1) {
      poVar2 = ::std::operator<<(local_1a8," (\n");
      print_attr_metas_abi_cxx11_(&sStack_1f8,this,(AttrMeta *)(ulong)((int)name + 1),uVar5);
      poVar2 = ::std::operator<<(poVar2,(string *)&sStack_1f8);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)name & 0xffffffff),n_00);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_1d8);
      ::std::operator<<(poVar2,")");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_1a8,"\n");
    psVar3 = *(string **)(this + 0x208);
    psVar6 = *(string **)(this + 0x210);
    uVar5 = extraout_EDX;
  }
  else {
    psVar3 = *(string **)(this + 0x208);
    psVar6 = *(string **)(this + 0x210);
    if ((psVar6 == psVar3) || (uVar5 = n, ((byte)this[0x234] & 1) == 0)) goto LAB_0025434a;
  }
  if (psVar6 != psVar3) {
    pprint::Indent_abi_cxx11_(&sStack_1f8,(pprint *)((ulong)name & 0xffffffff),uVar5);
    ::std::operator<<(local_1a8,(string *)&sStack_1f8);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,"uniform ");
    value::TypeTraits<std::array<float,4ul>>::type_name_abi_cxx11_();
    poVar2 = ::std::operator<<(local_1a8,(string *)&sStack_1f8);
    poVar2 = ::std::operator<<(poVar2," ");
    ::std::operator<<(poVar2,(string *)attr);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_1a8,".connect = ");
    lVar4 = (*(long *)(this + 0x210) - (long)*(Path **)(this + 0x208)) / 0xd0;
    if (lVar4 == 0) {
      ::std::operator<<(local_1a8,"[InternalError]");
    }
    else if (lVar4 == 1) {
      ::std::operator<<(local_1a8,*(Path **)(this + 0x208));
    }
    else {
      ::std::operator<<(local_1a8,
                        (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x208));
    }
  }
LAB_0025459d:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttributeWithFallback<T> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    // default
    if (attr.metas().authored() || attr.is_blocked() || (!attr.is_connection())) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else {
        ss << " = " << attr.get_value();
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
    }
  }

  return ss.str();
}